

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

Reg asm_fuseloadk64(ASMState *as,IRIns *ir)

{
  MCode *pMVar1;
  IRIns *pIVar2;
  MCode *pMVar3;
  IRIns *pIVar4;
  uint8_t uVar5;
  
  pIVar2 = ir + 1;
  uVar5 = 0x80;
  pIVar4 = pIVar2;
  if ((IRIns *)(long)(int)pIVar2 != pIVar2) {
    pIVar4 = (IRIns *)((long)pIVar2 + (-0xcc8 - (long)as->J));
    uVar5 = '\x0e';
    if ((IRIns *)(long)(int)pIVar4 != pIVar4) {
      pIVar4 = (IRIns *)((long)pIVar2 - (long)as->mcp);
      if (((((IRIns *)(long)(int)pIVar4 != pIVar4) ||
           ((ulong)((long)ir + (0x80000010 - (long)as->mcp)) >> 0x20 != 0)) ||
          ((ulong)((long)pIVar2 + (0x80000000 - (long)as->mctop)) >> 0x20 != 0)) ||
         (uVar5 = '%', (ulong)((long)ir + (0x80000010 - (long)as->mctop)) >> 0x20 != 0)) {
        if ((ir->field_1).op12 == 0) {
          while (pIVar2 = (IRIns *)as->mcbot, ((ulong)pIVar2 & 7) != 0) {
            as->mcbot = (MCode *)((long)&(pIVar2->field_0).op1 + 1);
            *(undefined1 *)pIVar2 = 0xcc;
          }
          *pIVar2 = ir[1];
          (ir->field_1).op12 = *(int *)&as->mctop - (int)pIVar2;
          pMVar3 = as->mcbot;
          pMVar1 = pMVar3 + 8;
          as->mcbot = pMVar1;
          as->mclim = pMVar3 + 0x48;
          as->J->mcbot = pMVar1;
        }
        uVar5 = '%';
        pIVar4 = (IRIns *)(as->mctop + (-(long)as->mcp - (long)ir->i));
      }
    }
  }
  (as->mrm).ofs = (Reg)pIVar4;
  (as->mrm).base = uVar5;
  (as->mrm).idx = 0x80;
  return (Reg)pIVar4;
}

Assistant:

static Reg asm_fuseloadk64(ASMState *as, IRIns *ir)
{
  const uint64_t *k = &ir_k64(ir)->u64;
  if (!LJ_GC64 || checki32((intptr_t)k)) {
    as->mrm.ofs = ptr2addr(k);
    as->mrm.base = RID_NONE;
#if LJ_GC64
  } else if (checki32(dispofs(as, k))) {
    as->mrm.ofs = (int32_t)dispofs(as, k);
    as->mrm.base = RID_DISPATCH;
  } else if (checki32(mcpofs(as, k)) && checki32(mcpofs(as, k+1)) &&
	     checki32(mctopofs(as, k)) && checki32(mctopofs(as, k+1))) {
    as->mrm.ofs = (int32_t)mcpofs(as, k);
    as->mrm.base = RID_RIP;
  } else {  /* Intern 64 bit constant at bottom of mcode. */
    if (ir->i) {
      lj_assertA(*k == *(uint64_t*)(as->mctop - ir->i),
		 "bad interned 64 bit constant");
    } else {
      while ((uintptr_t)as->mcbot & 7) *as->mcbot++ = XI_INT3;
      *(uint64_t*)as->mcbot = *k;
      ir->i = (int32_t)(as->mctop - as->mcbot);
      as->mcbot += 8;
      as->mclim = as->mcbot + MCLIM_REDZONE;
      lj_mcode_commitbot(as->J, as->mcbot);
    }
    as->mrm.ofs = (int32_t)mcpofs(as, as->mctop - ir->i);
    as->mrm.base = RID_RIP;
#endif
  }
  as->mrm.idx = RID_NONE;
  return RID_MRM;
}